

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O1

CURLcode Curl_req_set_upload_done(Curl_easy *data)

{
  undefined1 *puVar1;
  int *piVar2;
  uint uVar3;
  curl_trc_feat *pcVar4;
  CURLcode CVar5;
  curl_off_t cVar6;
  char *pcVar7;
  
  puVar1 = &(data->req).field_0xda;
  *puVar1 = *puVar1 | 1;
  piVar2 = &(data->req).keepon;
  *(byte *)piVar2 = (byte)*piVar2 & 0xbd;
  Curl_pgrsTime(data,TIMER_POSTRANSFER);
  Curl_creader_done(data,*(uint *)&(data->req).field_0xd9 >> 9 & 1);
  uVar3 = *(uint *)&(data->req).field_0xd9;
  if ((uVar3 >> 9 & 1) == 0) {
    if ((data->req).writebytecount == 0) {
      if (((data == (Curl_easy *)0x0 || (char)((uVar3 & 8) >> 3) != '\0') ||
          (((data->set).field_0x8cd & 0x10) == 0)) ||
         ((pcVar4 = (data->state).feat, pcVar4 != (curl_trc_feat *)0x0 && (pcVar4->log_level < 1))))
      goto LAB_0014c804;
      cVar6 = Curl_creader_total_length(data);
      pcVar7 = "We are completely uploaded and fine";
      if (cVar6 == 0) {
        pcVar7 = "Request completely sent off";
      }
LAB_0014c7fa:
      Curl_infof(data,pcVar7);
      goto LAB_0014c804;
    }
    if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
       ((pcVar4 = (data->state).feat, pcVar4 != (curl_trc_feat *)0x0 && (pcVar4->log_level < 1))))
    goto LAB_0014c804;
    pcVar7 = "upload completely sent off: %ld bytes";
  }
  else {
    Curl_bufq_reset(&(data->req).sendbuf);
    if ((data->req).writebytecount == 0) {
      if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
         ((pcVar4 = (data->state).feat, pcVar4 != (curl_trc_feat *)0x0 && (pcVar4->log_level < 1))))
      goto LAB_0014c804;
      pcVar7 = "abort upload";
      goto LAB_0014c7fa;
    }
    if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
       ((pcVar4 = (data->state).feat, pcVar4 != (curl_trc_feat *)0x0 && (pcVar4->log_level < 1))))
    goto LAB_0014c804;
    pcVar7 = "abort upload after having sent %ld bytes";
  }
  Curl_infof(data,pcVar7);
LAB_0014c804:
  CVar5 = Curl_xfer_send_close(data);
  return CVar5;
}

Assistant:

CURLcode Curl_req_set_upload_done(struct Curl_easy *data)
{
  DEBUGASSERT(!data->req.upload_done);
  data->req.upload_done = TRUE;
  data->req.keepon &= ~(KEEP_SEND|KEEP_SEND_TIMED); /* we are done sending */

  Curl_pgrsTime(data, TIMER_POSTRANSFER);
  Curl_creader_done(data, data->req.upload_aborted);

  if(data->req.upload_aborted) {
    Curl_bufq_reset(&data->req.sendbuf);
    if(data->req.writebytecount)
      infof(data, "abort upload after having sent %" FMT_OFF_T " bytes",
            data->req.writebytecount);
    else
      infof(data, "abort upload");
  }
  else if(data->req.writebytecount)
    infof(data, "upload completely sent off: %" FMT_OFF_T " bytes",
          data->req.writebytecount);
  else if(!data->req.download_done) {
    DEBUGASSERT(Curl_bufq_is_empty(&data->req.sendbuf));
    infof(data, Curl_creader_total_length(data)?
                "We are completely uploaded and fine" :
                "Request completely sent off");
  }

  return Curl_xfer_send_close(data);
}